

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5ExprNodeTest_AND(Fts5Expr *pExpr,Fts5ExprNode *pAnd)

{
  Fts5ExprNode *pFVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  i64 iLhs;
  
  iLhs = pAnd->iRowid;
  do {
    bVar3 = true;
    pAnd->bNomatch = 0;
    for (lVar5 = 0; lVar5 < pAnd->nChild; lVar5 = lVar5 + 1) {
      pFVar1 = pAnd->apChild[lVar5];
      iVar4 = fts5RowidCmp(pExpr,iLhs,pFVar1->iRowid);
      if ((0 < iVar4) && (iVar4 = (*pFVar1->xNext)(pExpr,pFVar1,1,iLhs), iVar4 != 0)) {
        pAnd->bNomatch = 0;
        return iVar4;
      }
      if (pFVar1->bEof != 0) {
        fts5ExprSetEof(pAnd);
        goto LAB_001929ce;
      }
      lVar2 = pFVar1->iRowid;
      if (iLhs != lVar2) {
        bVar3 = false;
      }
      if (pFVar1->bNomatch != 0) {
        pAnd->bNomatch = 1;
      }
      iLhs = lVar2;
    }
    if (bVar3) {
LAB_001929ce:
      if ((pAnd->bNomatch != 0) && (pExpr->pRoot != pAnd)) {
        fts5ExprNodeZeroPoslist(pAnd);
      }
      pAnd->iRowid = iLhs;
      return 0;
    }
  } while( true );
}

Assistant:

static int fts5ExprNodeTest_AND(
  Fts5Expr *pExpr,                /* Expression pPhrase belongs to */
  Fts5ExprNode *pAnd              /* FTS5_AND node to advance */
){
  int iChild;
  i64 iLast = pAnd->iRowid;
  int rc = SQLITE_OK;
  int bMatch;

  assert( pAnd->bEof==0 );
  do {
    pAnd->bNomatch = 0;
    bMatch = 1;
    for(iChild=0; iChild<pAnd->nChild; iChild++){
      Fts5ExprNode *pChild = pAnd->apChild[iChild];
      int cmp = fts5RowidCmp(pExpr, iLast, pChild->iRowid);
      if( cmp>0 ){
        /* Advance pChild until it points to iLast or laster */
        rc = fts5ExprNodeNext(pExpr, pChild, 1, iLast);
        if( rc!=SQLITE_OK ){
          pAnd->bNomatch = 0;
          return rc;
        }
      }

      /* If the child node is now at EOF, so is the parent AND node. Otherwise,
      ** the child node is guaranteed to have advanced at least as far as
      ** rowid iLast. So if it is not at exactly iLast, pChild->iRowid is the
      ** new lastest rowid seen so far.  */
      assert( pChild->bEof || fts5RowidCmp(pExpr, iLast, pChild->iRowid)<=0 );
      if( pChild->bEof ){
        fts5ExprSetEof(pAnd);
        bMatch = 1;
        break;
      }else if( iLast!=pChild->iRowid ){
        bMatch = 0;
        iLast = pChild->iRowid;
      }

      if( pChild->bNomatch ){
        pAnd->bNomatch = 1;
      }
    }
  }while( bMatch==0 );

  if( pAnd->bNomatch && pAnd!=pExpr->pRoot ){
    fts5ExprNodeZeroPoslist(pAnd);
  }
  pAnd->iRowid = iLast;
  return SQLITE_OK;
}